

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::skipWhiteSpace(Parser *this)

{
  bool bVar1;
  TokenBuffer local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  while( true ) {
    TokenBuffer::currentToken
              ((TokenBuffer *)
               &local_60.tokenList.
                super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                _M_impl._M_node._M_size);
    if (*(int *)(local_60.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node._M_size + 0x20) == 1) {
      bVar1 = false;
    }
    else {
      TokenBuffer::currentToken
                ((TokenBuffer *)
                 &local_60.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = *(int *)&local_60.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[2]._vptr__Sp_counted_base == 4;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    if (local_60.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_60.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    if (!bVar1) break;
    TokenBuffer::nextToken(&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_60.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_60.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node.super__List_node_base._M_prev);
    }
  }
  return;
}

Assistant:

void Parser::skipWhiteSpace() noexcept {
  while (
      this->tokenBuffer->currentToken()->tokenType != TokenType::EndOfFile
      && this->tokenBuffer->currentToken()->tokenType == TokenType::WhiteSpace) {
    this->tokenBuffer->nextToken();
  }
}